

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test7::logVariableContents(GPUShaderFP64Test7 *this,_variables *variables)

{
  int iVar1;
  _variable_type type;
  deUint32 dVar2;
  _variable_type _Var3;
  uint uVar4;
  undefined4 extraout_var;
  ostream *poVar6;
  size_t sVar7;
  uchar *data_ptr;
  uint uVar8;
  pointer p_Var9;
  stringstream log_sstream;
  ulong local_390;
  long *local_358;
  long local_348 [2];
  undefined1 local_338 [8];
  _func_int **local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [6];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  long lVar5;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Test variable values as retrieved from geometry shader:\n",0x38);
  type = (**(code **)(lVar5 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  data_ptr = (uchar *)0x2807;
  glu::checkError(dVar2,"glMapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2807);
  p_Var9 = (variables->
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (p_Var9 != (variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      _Var3 = Utils::getBaseVariableType(p_Var9->type);
      uVar4 = Utils::getNumberOfComponentsForVariableType(p_Var9->type);
      if (p_Var9->array_size != 0) {
        local_390 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gs_variable",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          if (1 < p_Var9->array_size) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": (",3);
          uVar8 = uVar4;
          do {
            Utils::getStringForVariableTypeValue_abi_cxx11_
                      ((string *)local_338,(Utils *)(ulong)_Var3,type,data_ptr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_338,(long)local_330);
            if (local_338 != (undefined1  [8])local_328) {
              operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
            }
            if (uVar8 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            }
            type = type + VARIABLE_TYPE_DMAT3;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")\n",2);
          local_390 = local_390 + 1;
        } while (local_390 < p_Var9->array_size);
      }
      p_Var9 = p_Var9 + 1;
    } while (p_Var9 != (variables->
                       super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  (**(code **)(lVar5 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2832);
  local_338 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
  std::__cxx11::stringbuf::str();
  if (local_358 == (long *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_330 + (int)local_330[-3]);
  }
  else {
    sVar7 = strlen((char *)local_358);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,(char *)local_358,sVar7);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
  std::ios_base::~ios_base(local_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void GPUShaderFP64Test7::logVariableContents(const _variables& variables)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	std::stringstream	 log_sstream;

	log_sstream << "Test variable values as retrieved from geometry shader:\n";

	/* Map the XFB BO contents into process space */
	const void* xfb_bo_data = gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

	/* Read the variable contents. We only care about the set of varyings emitted
	 * for first vertex in the geometry shader */
	unsigned int		 n_varying	 = 0;
	const unsigned char* traveller_ptr = (const unsigned char*)xfb_bo_data;

	for (_variables_const_iterator variables_iterator = variables.begin(); variables_iterator != variables.end();
		 ++variables_iterator, ++n_varying)
	{
		const _variable&			 variable			= *variables_iterator;
		const Utils::_variable_type& base_variable_type = Utils::getBaseVariableType(variable.type);
		const unsigned int			 n_components		= Utils::getNumberOfComponentsForVariableType(variable.type);

		for (unsigned int array_index = 0; array_index < variable.array_size; ++array_index)
		{
			log_sstream << "gs_variable" << n_varying;

			if (variable.array_size > 1)
			{
				log_sstream << "[" << array_index << "]";
			}

			log_sstream << ": (";

			for (unsigned int n_component = 0; n_component < n_components; ++n_component)
			{
				log_sstream << Utils::getStringForVariableTypeValue(base_variable_type, traveller_ptr);

				if (n_component != (n_components - 1))
				{
					log_sstream << ", ";
				}

				traveller_ptr += sizeof(double);
			}

			log_sstream << ")\n";
		} /* for (all array indices) */
	}	 /* for (all variables) */

	/* Unmap the BO */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	/* Pass the logged stream into the framework */
	m_testCtx.getLog() << tcu::TestLog::Message << log_sstream.str().c_str() << tcu::TestLog::EndMessage;
}